

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

String * Lexer::DescribeTokenPrivate(String *__return_storage_ptr__,Token tokType,TokenInfo *tok)

{
  char *data;
  string *this;
  String SStack_58;
  String local_38;
  
  this = (string *)&SStack_58;
  if ((int)tokType < 0x49) {
    LexerScanner::GetTokenString(LeftShiftAssign);
    ::operator+(&SStack_58,"\"",&local_38);
    String::operator+(__return_storage_ptr__,&SStack_58,"\"");
    std::__cxx11::string::~string((string *)&SStack_58);
    this = (string *)&local_38;
LAB_001224fb:
    std::__cxx11::string::~string(this);
    return __return_storage_ptr__;
  }
  switch(tokType) {
  case Symbol:
    if (tok != (TokenInfo *)0x0) {
LAB_0012256f:
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tok->text);
      return __return_storage_ptr__;
    }
    data = "a symbol";
    break;
  case Number:
    if (tok != (TokenInfo *)0x0) goto LAB_0012256f;
    data = "a number";
    break;
  case String:
    if (tok != (TokenInfo *)0x0) {
      ::operator+(&SStack_58,"\"",&tok->text);
      String::operator+(__return_storage_ptr__,&SStack_58,"\"");
      goto LAB_001224fb;
    }
    data = "a string";
    break;
  case Any:
    if (tok != (TokenInfo *)0x0) goto LAB_0012256f;
    data = "any token";
    break;
  default:
    data = "";
  }
  String::String(__return_storage_ptr__,data);
  return __return_storage_ptr__;
}

Assistant:

String Lexer::DescribeTokenPrivate (Token tokType, Lexer::TokenInfo* tok)
{
	if (tokType < LastNamedToken)
		return "\"" + LexerScanner::GetTokenString (tokType) + "\"";

	switch (tokType)
	{
		case Token::Symbol:	return tok ? tok->text : "a symbol";
		case Token::Number:	return tok ? tok->text : "a number";
		case Token::String:	return tok ? ("\"" + tok->text + "\"") : "a string";
		case Token::Any:	return tok ? tok->text : "any token";
		default: break;
	}

	return "";
}